

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcRec3.c
# Opt level: O2

Vec_Int_t * Lms_GiaCollectUsefulCos(Lms_Man_t *p)

{
  int iVar1;
  int iVar2;
  Vec_Int_t *p_00;
  Vec_Int_t *p_01;
  Vec_Int_t *p_02;
  int *piVar3;
  int Addition;
  int iVar4;
  int iVar5;
  int iVar6;
  
  p_00 = Vec_IntAlloc(p->vTtMem->nEntries);
  p_01 = Vec_IntStartFull(p->vTtMem->nEntries + p->pGia->vCos->nSize);
  p_02 = Lms_GiaCountTruths(p);
  iVar2 = p_02->nSize;
  iVar4 = 0;
  iVar5 = 0;
  if (0 < iVar2) {
    iVar5 = iVar2;
  }
  iVar6 = 0;
  while( true ) {
    if (iVar5 == iVar4) {
      Vec_IntPush(p_00,iVar6);
      iVar5 = 0;
      Vec_IntFill(p_02,iVar2,0);
      do {
        if (p->vTruthIds->nSize <= iVar5) {
          Vec_IntFree(p_00);
          Vec_IntFree(p_02);
          return p_01;
        }
        iVar2 = Vec_IntEntry(p->vTruthIds,iVar5);
        if (-1 < iVar2) {
          iVar4 = Vec_IntEntry(p_00,iVar2);
          iVar6 = Vec_IntEntry(p_02,iVar2);
          piVar3 = Vec_IntEntryP(p_01,iVar4 + iVar6);
          if (*piVar3 != -1) {
            __assert_fail("*pPlace == -1",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abci/abcRec3.c"
                          ,0x4c7,"Vec_Int_t *Lms_GiaCollectUsefulCos(Lms_Man_t *)");
          }
          *piVar3 = iVar5;
          Vec_IntAddToEntry(p_02,iVar2,Addition);
        }
        iVar5 = iVar5 + 1;
      } while( true );
    }
    iVar1 = Vec_IntEntry(p_02,iVar4);
    if (iVar1 < 1) break;
    Vec_IntPush(p_00,iVar6);
    iVar6 = iVar6 + iVar1 + 1;
    iVar4 = iVar4 + 1;
  }
  __assert_fail("Entry > 0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abci/abcRec3.c"
                ,0x4ba,"Vec_Int_t *Lms_GiaCollectUsefulCos(Lms_Man_t *)");
}

Assistant:

Vec_Int_t * Lms_GiaCollectUsefulCos( Lms_Man_t * p )
{
    Vec_Int_t * vBegins = Vec_IntAlloc( Vec_MemEntryNum(p->vTtMem) );
    Vec_Int_t * vUseful = Vec_IntStartFull( Gia_ManCoNum(p->pGia) + Vec_MemEntryNum(p->vTtMem) );
    Vec_Int_t * vCounts = Lms_GiaCountTruths( p );
    int i, Entry, * pPlace, SumTotal = 0;
    // mark up the place for POs
    Vec_IntForEachEntry( vCounts, Entry, i )
    {
        assert( Entry > 0 );
        Vec_IntPush( vBegins, SumTotal );
        SumTotal += Entry + 1;
//        printf( "%d ", Entry );
    }
    Vec_IntPush( vBegins, SumTotal );
    // fill out POs in their places
    Vec_IntFill( vCounts, Vec_IntSize(vCounts), 0 );
    Vec_IntForEachEntry( p->vTruthIds, Entry, i )
    {
        if ( Entry < 0 )
            continue;
        pPlace = Vec_IntEntryP( vUseful, Vec_IntEntry(vBegins, Entry) + Vec_IntEntry(vCounts, Entry) );
        assert( *pPlace == -1 );
        *pPlace = i;
        Vec_IntAddToEntry( vCounts, Entry, 1 );
    }
    Vec_IntFree( vBegins );
    Vec_IntFree( vCounts );
    return vUseful;
}